

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void readparameters(uint32 numparams,uint8 *base,uint8 **ptr,uint32 *len,
                   MOJOSHADER_effectParam **params,MOJOSHADER_effectObject *objects,
                   MOJOSHADER_malloc m,void *d)

{
  uint32 typeoffset_00;
  uint32 valoffset_00;
  uint32 numannos_00;
  MOJOSHADER_effectParam *pMVar1;
  uint32 numannos;
  uint32 valoffset;
  uint32 typeoffset;
  MOJOSHADER_effectParam *param;
  uint32 siz;
  int i;
  MOJOSHADER_effectObject *objects_local;
  MOJOSHADER_effectParam **params_local;
  uint32 *len_local;
  uint8 **ptr_local;
  uint8 *base_local;
  uint32 numparams_local;
  
  if (numparams != 0) {
    pMVar1 = (MOJOSHADER_effectParam *)(*m)(numparams * 0x50,d);
    *params = pMVar1;
    memset(*params,0,(ulong)(numparams * 0x50));
    for (param._4_4_ = 0; param._4_4_ < numparams; param._4_4_ = param._4_4_ + 1) {
      pMVar1 = *params + (int)param._4_4_;
      typeoffset_00 = readui32(ptr,len);
      valoffset_00 = readui32(ptr,len);
      readui32(ptr,len);
      numannos_00 = readui32(ptr,len);
      pMVar1->annotation_count = numannos_00;
      readannotations(numannos_00,base,ptr,len,&pMVar1->annotations,objects,m,d);
      readvalue(base,typeoffset_00,valoffset_00,&pMVar1->value,objects,m,d);
    }
  }
  return;
}

Assistant:

static void readparameters(const uint32 numparams,
                           const uint8 *base,
                           const uint8 **ptr,
                           uint32 *len,
                           MOJOSHADER_effectParam **params,
                           MOJOSHADER_effectObject *objects,
                           MOJOSHADER_malloc m,
                           void *d)
{
    int i;
    if (numparams == 0) return;

    uint32 siz = sizeof(MOJOSHADER_effectParam) * numparams;
    *params = (MOJOSHADER_effectParam *) m(siz, d);
    memset(*params, '\0', siz);

    for (i = 0; i < numparams; i++)
    {
        MOJOSHADER_effectParam *param = &(*params)[i];

        const uint32 typeoffset = readui32(ptr, len);
        const uint32 valoffset = readui32(ptr, len);
        /*const uint32 flags =*/ readui32(ptr, len);
        const uint32 numannos = readui32(ptr, len);

        param->annotation_count = numannos;
        readannotations(numannos, base, ptr, len,
                        &param->annotations, objects,
                        m, d);

        readvalue(base, typeoffset, valoffset,
                  &param->value, objects,
                  m, d);
    } // for
}